

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void __thiscall
cubeb_passthrough_resampler_fill_input_left_Test::TestBody
          (cubeb_passthrough_resampler_fill_input_left_Test *this)

{
  int line;
  uint32_t i;
  long lVar1;
  char *pcVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  AssertionResult gtest_ar;
  int iteration;
  long input_frame_count;
  AssertHelper local_2f8;
  long output_frame_count;
  long got;
  passthrough_resampler<float> resampler;
  float output [64];
  float input [96];
  
  iteration = 0;
  passthrough_resampler<float>::passthrough_resampler
            (&resampler,(cubeb_stream *)0x0,passthrough_resampler_fill_input_left,&iteration,2,
             0xac44);
  input_frame_count = 0x30;
  output_frame_count = 0x20;
  memset(input,0,0x180);
  memset(output,0,0x100);
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 1) {
    input[lVar1] = (float)(int)lVar1 * 0.01;
  }
  iteration = 1;
  got = passthrough_resampler<float>::fill(&resampler,input,&input_frame_count,output,0x20);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"got","output_frame_count",&got,&output_frame_count);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_320);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    line = 0x416;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&gtest_ar,"input_frame_count","output_frame_count",&input_frame_count,
               &output_frame_count);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_320);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      line = 0x418;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      input_frame_count = 0x20;
      iteration = 2;
      got = passthrough_resampler<float>::fill(&resampler,input,&input_frame_count,output,0x20);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"got","output_frame_count",&got,&output_frame_count);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_320);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        line = 0x41f;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&gtest_ar,"input_frame_count","output_frame_count",&input_frame_count
                   ,&output_frame_count);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_320);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x421;
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          input_frame_count = 8;
          iteration = 3;
          got = passthrough_resampler<float>::fill(&resampler,input,&input_frame_count,output,0x20);
          testing::internal::CmpHelperEQ<long,long>
                    ((internal *)&gtest_ar,"got","output_frame_count",&got,&output_frame_count);
          if (gtest_ar.success_ != false) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&gtest_ar.message_);
            local_320.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
            testing::internal::CmpHelperEQ<long,long>
                      ((internal *)&gtest_ar,"input_frame_count","output_frame_count - 8",
                       &input_frame_count,(long *)&local_320);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&local_320);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_2f8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                         ,0x42a,pcVar2);
              testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_320);
              testing::internal::AssertHelper::~AssertHelper(&local_2f8);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&local_320);
            }
            goto LAB_0010a9f4;
          }
          testing::Message::Message((Message *)&local_320);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          line = 0x428;
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_2f8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,line,pcVar2);
  testing::internal::AssertHelper::operator=(&local_2f8,(Message *)&local_320);
  testing::internal::AssertHelper::~AssertHelper(&local_2f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_320);
LAB_0010a9f4:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  passthrough_resampler<float>::~passthrough_resampler(&resampler);
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_input_left) {
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  int iteration = 0;
  passthrough_resampler<float> resampler =
    passthrough_resampler<float>(nullptr, passthrough_resampler_fill_input_left,
                                 &iteration, channels, sample_rate);

  long input_frame_count = 48; // 32 + 16
  const long output_frame_count = 32;
  float input[96] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }

  // 1st iteration, add the extra input.
  iteration = 1;
  long got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 2st iteration, use the extra input from previous iteration,
  // 16 frames are remaining in the input buffer.
  input_frame_count = 32; // we need 16 input frames but we get more;
  iteration = 2;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used must be equal to output frames.
  ASSERT_EQ(input_frame_count, output_frame_count);

  // 3rd iteration, use the extra input from previous iteration.
  // 16 frames are remaining in the input buffer.
  input_frame_count = 16 - 8; // We need 16 more input frames but we only get 8.
  iteration = 3;
  got = resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 8);
}